

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

int luaB_rawget(lua_State *L)

{
  StkId pTVar1;
  StkId pTVar2;
  TValue *pTVar3;
  StkId pTVar4;
  StkId t;
  
  luaL_checktype(L,1,5);
  luaL_checkany(L,2);
  pTVar4 = L->top;
  pTVar2 = L->base;
  pTVar1 = pTVar2 + 2;
  if (pTVar4 < pTVar1) {
    do {
      pTVar4->tt = 0;
      pTVar4 = pTVar4 + 1;
    } while (pTVar4 < pTVar1);
    L->top = pTVar4;
  }
  L->top = pTVar1;
  pTVar3 = luaH_get(&((pTVar2->value).gc)->h,pTVar2 + 1);
  pTVar2[1].value = pTVar3->value;
  pTVar2[1].tt = pTVar3->tt;
  return 1;
}

Assistant:

static int luaB_rawget(lua_State*L){
luaL_checktype(L,1,5);
luaL_checkany(L,2);
lua_settop(L,2);
lua_rawget(L,1);
return 1;
}